

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O0

bool __thiscall f8n::prefs::Preferences::GetBool(Preferences *this,char *key,bool defaultValue)

{
  int iVar1;
  allocator<char> local_41;
  string local_40 [39];
  byte local_19;
  char *pcStack_18;
  bool defaultValue_local;
  char *key_local;
  Preferences *this_local;
  
  local_19 = defaultValue;
  pcStack_18 = key;
  key_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,key,&local_41);
  iVar1 = (*(this->super_IPreferences)._vptr_IPreferences[10])(this,local_40,(ulong)(local_19 & 1));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool Preferences::GetBool(const char* key, bool defaultValue) {
    return this->GetBool(std::string(key), defaultValue);
}